

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O3

Module __thiscall tvm::runtime::TVMRetValue::operator_cast_to_Module(TVMRetValue *this)

{
  uint uVar1;
  int64_t *piVar2;
  long lVar3;
  ostream *poVar4;
  size_t sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  char *__s;
  Module MVar6;
  LogCheckError _check_err;
  LogCheckError local_338;
  LogMessageFatal local_330;
  LogMessageFatal local_1a8;
  
  local_1a8.log_stream_ = (ostringstream)0x9;
  local_1a8._1_3_ = 0;
  dmlc::LogCheck_EQ<int,TVMTypeCode>
            ((dmlc *)&local_338,(int *)(in_RSI + 1),(anon_enum_32 *)&local_1a8);
  if (local_338.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_330,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
               ,0x2a5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_330,"type_code_ == kModuleHandle",0x1b);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_330,((local_338.str)->_M_dataplus)._M_p,
                        (local_338.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," expected ",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ModuleHandle",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," but get ",9);
    uVar1 = *(uint *)(in_RSI + 1);
    if ((ulong)uVar1 < 0xe) {
      __s = &DAT_00136684 + *(int *)(&DAT_00136684 + (ulong)uVar1 * 4);
    }
    else {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/include/tvm/runtime/packed_func.h"
                 ,0x3ab);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"unknown type_code=",0x12);
      std::ostream::operator<<(&local_1a8,uVar1);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
      __s = "";
    }
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar5);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_330);
  }
  dmlc::LogCheckError::~LogCheckError(&local_338);
  piVar2 = (int64_t *)*in_RSI;
  (this->super_TVMPODValue_).value_.v_int64 = *piVar2;
  lVar3 = piVar2[1];
  *(long *)&(this->super_TVMPODValue_).type_code_ = lVar3;
  if (lVar3 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
    }
  }
  MVar6.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  MVar6.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Module)MVar6.node_.
                 super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

operator Module() const {
    TVM_CHECK_TYPE_CODE(type_code_, kModuleHandle);
    return *ptr<Module>();
  }